

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O1

string * flatbuffers::anon_unknown_7::ToValueString<unsigned_short>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  uint __val;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar1;
  ulong uVar2;
  byte *pbVar3;
  uint __len;
  string __str;
  string local_60;
  uint local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_3c = (uint)*(ushort *)(binary + region->offset);
  if (region->length != 0) {
    pbVar3 = binary + region->offset + region->length;
    uVar2 = 0;
    uVar1 = extraout_RDX;
    do {
      pbVar3 = pbVar3 + -1;
      ToHex_abi_cxx11_(&local_60,(flatbuffers *)(ulong)*pbVar3,(uint8_t)uVar1);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      uVar1 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        uVar1 = extraout_RDX_01;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < region->length);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __val = local_3c;
  __len = 1;
  if (((9 < (ushort)local_3c) && (__len = 2, 99 < (ushort)local_3c)) && (__len = 3, 999 < local_3c))
  {
    __len = 5 - (local_3c < 10000);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_60._M_dataplus._M_p,__len,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}